

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodstobin.cpp
# Opt level: O2

void doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  Periods p;
  char line [4096];
  
  fgets(line,0x1000,_stdin);
  uVar3 = 1;
  while( true ) {
    pcVar2 = fgets(line,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(line,"%d,%lf",&p,&p.weighting);
    if (iVar1 != 2) break;
    fwrite(&p,0xc,1,_stdout);
    uVar3 = uVar3 + 1;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,line);
  return;
}

Assistant:

void doit()
{

	Periods p;
    char line[4096];
    int lineno=0;

	fgets(line, sizeof(line), stdin);
	lineno++;
    while (fgets(line, sizeof(line), stdin) != 0)
    {
		if (sscanf(line, "%d,%lf", &p.period_no, &p.weighting) != 2){
           fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
           return;
       }

	    else
       {		   
           fwrite(&p, sizeof(p), 1, stdout);
       }
       lineno++;
    }

}